

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ImageFeatureType_ImageSizeRange::CopyFrom
          (ImageFeatureType_ImageSizeRange *this,ImageFeatureType_ImageSizeRange *from)

{
  if (from != this) {
    if (this->widthrange_ != (SizeRange *)0x0) {
      (*(this->widthrange_->super_MessageLite)._vptr_MessageLite[1])();
    }
    this->widthrange_ = (SizeRange *)0x0;
    if (this->heightrange_ != (SizeRange *)0x0) {
      (*(this->heightrange_->super_MessageLite)._vptr_MessageLite[1])();
    }
    this->heightrange_ = (SizeRange *)0x0;
    MergeFrom(this,from);
    return;
  }
  return;
}

Assistant:

void ImageFeatureType_ImageSizeRange::CopyFrom(const ImageFeatureType_ImageSizeRange& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.ImageFeatureType.ImageSizeRange)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}